

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined4 uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  _func_void_int *local_78;
  thread local_70;
  int local_64;
  in_addr_t local_60;
  int mlen;
  socklen_t local_58;
  int res;
  socklen_t addr_size;
  int i;
  undefined1 local_3c [4];
  in_addr_t local_38;
  sockaddr_in addr;
  uint port;
  int sock_client;
  int sockfd;
  thread tsend;
  char **argv_local;
  int argc_local;
  
  tsend._M_id._M_thread = (id)(id)argv;
  std::thread::thread((thread *)&sock_client);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    perror("Erro ao criar socket");
  }
  else {
    addr.sin_zero[0] = 0xe0;
    addr.sin_zero[1] = '\x15';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    for (res = 0; res < argc; res = res + 1) {
      iVar2 = strcmp(*(char **)((long)tsend._M_id._M_thread + (long)res * 8),"--port");
      if (iVar2 == 0) {
        iVar2 = atoi(*(char **)((long)tsend._M_id._M_thread + 8 + (long)res * 8));
        addr.sin_zero._0_4_ = SEXT24((short)iVar2);
        printf("porta: %d\n");
        break;
      }
    }
    local_3c._0_2_ = 2;
    local_3c._2_2_ = htons(addr.sin_zero._0_2_);
    local_38 = 0;
    memset(&addr,0,8);
    iVar2 = bind(__fd,(sockaddr *)local_3c,0x10);
    if (iVar2 == -1) {
      perror("Erro na funcao bind()");
    }
    else {
      iVar2 = listen(__fd,1);
      if (iVar2 == -1) {
        printf("Erro na funcao listen()\n");
      }
      else {
        while (addr.sin_zero._4_4_ = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0),
              addr.sin_zero._4_4_ != -1) {
          local_58 = 0x10;
          mlen = getpeername(addr.sin_zero._4_4_,(sockaddr *)local_3c,&local_58);
          uVar1 = addr.sin_zero._4_4_;
          local_60 = local_38;
          pcVar3 = inet_ntoa((in_addr)local_38);
          printf("\x1b[94mClient connected\x1b[0m: %d (%s)\n",(ulong)(uint)uVar1,pcVar3);
          sVar4 = recv(addr.sin_zero._4_4_,names + (int)addr.sin_zero._4_4_,1000,0);
          local_64 = (int)sVar4;
          if ((local_64 == -1) || (local_64 == 0)) {
            close(addr.sin_zero._4_4_);
          }
          else {
            names[(int)addr.sin_zero._4_4_][local_64] = '\0';
            std::mutex::lock(&mutsocks);
            std::vector<int,_std::allocator<int>_>::push_back
                      (&socks,(value_type *)(addr.sin_zero + 4));
            std::mutex::unlock(&mutsocks);
            send_thread();
            local_78 = rcv_thread;
            std::thread::thread<void(*)(int),int&,void>
                      (&local_70,&local_78,(int *)(addr.sin_zero + 4));
            std::thread::detach();
            std::thread::~thread(&local_70);
          }
        }
        perror("Erro na funcao accept()");
      }
    }
  }
  addr_size = 1;
  std::thread::~thread((thread *)&sock_client);
  return 1;
}

Assistant:

int main(int argc, char **argv) {

  std::thread tsend;
  int sockfd, sock_client;
  unsigned int port;
  struct sockaddr_in addr;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);

  if(sockfd == -1) {
    perror("Erro ao criar socket");
    return 1;
  }
  port = 5600;
  for (int i = 0; i < argc; i++) {
    if(strcmp(argv[i],"--port") == 0) {
      port = (short)atoi(argv[i+1]);
      printf("porta: %d\n", port);
      break;
    }
  }



  addr.sin_family = AF_INET;
  addr.sin_port   = htons(port);
  addr.sin_addr.s_addr = INADDR_ANY;

  memset(&addr.sin_zero,0,sizeof(addr.sin_zero));

  if(bind(sockfd,(struct sockaddr*)&addr,sizeof(addr)) == -1) {
    perror("Erro na funcao bind()");
    return 1;
  }
  if(listen(sockfd,1) == -1) {
    printf("Erro na funcao listen()\n");
    return 1;
  }

  while(1) {
    sock_client = accept(sockfd,0,0);
    if(sock_client == -1) {
      perror("Erro na funcao accept()");
      return 1;
    }
    else {
      // Get client info
      socklen_t addr_size = sizeof(struct sockaddr_in);
      int res = getpeername(sock_client, (struct sockaddr*)&addr, &addr_size);
      printf("\033[94mClient connected\033[0m: %d (%s)\n", sock_client, inet_ntoa(addr.sin_addr));
      int mlen = recv(sock_client, names[sock_client], MSG_LEN,0);
      if(mlen == -1 || mlen == 0) {
        close(sock_client);
      }
      else {
        names[sock_client][mlen]='\0';
        mutsocks.lock();
        socks.push_back(sock_client);
        mutsocks.unlock();
        send_thread();
        std::thread(&rcv_thread,sock_client).detach();
      }
    }
  }

  tsend.join();
  for(int i = 0; i < socks.size(); i++) {
    close(socks[i]);
  }

  close(sockfd);
  return 0;
}